

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RWNode.h
# Opt level: O3

bool __thiscall dg::dda::RWNode::isDynAlloc(RWNode *this)

{
  bool bVar1;
  RWCalledValue *cv;
  void *pvVar2;
  
  bVar1 = true;
  if (this->type != DYN_ALLOC) {
    if (this->type == CALL) {
      for (pvVar2 = *(void **)&this[1].super_SubgraphNode<dg::dda::RWNode>;
          pvVar2 != this[1].super_SubgraphNode<dg::dda::RWNode>.data;
          pvVar2 = (void *)((long)pvVar2 + 0x10)) {
        if ((*(long *)((long)pvVar2 + 8) != 0) &&
           (*(int *)(*(long *)((long)pvVar2 + 8) + 0x90) == 2)) {
          return true;
        }
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

RWNodeType getType() const { return type; }